

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetPchUseCompileOptions
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  char *pcVar2;
  _Base_ptr p_Var3;
  size_type sVar4;
  cmGeneratorTarget *this_01;
  string *config_00;
  bool bVar5;
  long *plVar6;
  string *psVar7;
  _Base_ptr p_Var8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar9;
  string useOptVar;
  string pchHeader;
  string pchFile;
  undefined1 local_118 [32];
  _Base_ptr local_f8;
  undefined1 local_f0 [24];
  char *pcStack_d8;
  char *local_d0;
  char *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  _Base_ptr local_a0;
  string local_98;
  cmGeneratorTarget *local_78;
  cmMakefile *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  string local_50;
  
  local_60 = config;
  std::operator+(&local_c0,language,config);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c0,(ulong)(arch->_M_dataplus)._M_p);
  p_Var3 = (_Base_ptr)(local_118 + 0x10);
  p_Var8 = (_Base_ptr)(plVar6 + 2);
  if ((_Base_ptr)*plVar6 == p_Var8) {
    local_118._16_8_ = *(undefined8 *)p_Var8;
    local_118._24_8_ = plVar6[3];
    local_118._0_8_ = p_Var3;
  }
  else {
    local_118._16_8_ = *(undefined8 *)p_Var8;
    local_118._0_8_ = (_Base_ptr)*plVar6;
  }
  local_f0._8_8_ = plVar6[1];
  *plVar6 = (long)p_Var8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  p_Var8 = (_Base_ptr)(local_f0 + 0x10);
  if ((_Base_ptr)local_118._0_8_ == p_Var3) {
    pcStack_d8 = (char *)local_118._24_8_;
    local_f0._0_8_ = p_Var8;
  }
  else {
    local_f0._0_8_ = local_118._0_8_;
  }
  local_f0._16_8_ = local_118._16_8_;
  local_118._8_8_ = 0;
  local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
  local_d0 = "";
  local_118._0_8_ = p_Var3;
  local_68 = arch;
  local_58 = __return_storage_ptr__;
  pVar9 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->PchUseCompileOptions,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                      *)local_f0);
  local_a0 = (_Base_ptr)pVar9.first._M_node;
  if ((_Base_ptr)local_f0._0_8_ != p_Var8) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if ((_Base_ptr)local_118._0_8_ != p_Var3) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_f0._0_8_ = p_Var8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"PCH_WARN_INVALID","");
    bVar5 = cmTarget::GetPropertyAsBool(this->Target,(string *)local_f0);
    if ((_Base_ptr)local_f0._0_8_ != p_Var8) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    local_f8 = local_a0 + 2;
    if (bVar5) {
      this_00 = this->Makefile;
      pcStack_d8 = (language->_M_dataplus)._M_p;
      local_f0._16_8_ = language->_M_string_length;
      local_f0._0_8_ = (pointer)0x6;
      local_f0._8_8_ = "CMAKE_";
      local_d0 = (char *)0x1c;
      local_c8 = "_COMPILE_OPTIONS_INVALID_PCH";
      views._M_len = 3;
      views._M_array = (iterator)local_f0;
      cmCatViews_abi_cxx11_((string *)local_118,views);
      cmMakefile::GetSafeDefinition(this_00,(string *)local_118);
      std::__cxx11::string::_M_assign((string *)local_f8);
      if ((_Base_ptr)local_118._0_8_ != p_Var3) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
    }
    local_f0._8_8_ = (language->_M_dataplus)._M_p;
    local_f0._0_8_ = language->_M_string_length;
    local_f0._16_8_ = 0x18;
    pcStack_d8 = "_COMPILE_OPTIONS_USE_PCH";
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_f0;
    cmCatViews_abi_cxx11_((string *)local_118,views_00);
    psVar7 = (string *)GetProperty(this,(string *)local_118);
    if (psVar7 == (string *)0x0) {
      psVar7 = &cmValue::Empty_abi_cxx11_;
    }
    pcVar2 = *(char **)(local_a0 + 2);
    p_Var3 = local_a0[2]._M_parent;
    sVar4 = psVar7->_M_string_length;
    local_78 = this;
    if (sVar4 == 0) {
      local_70 = this->Makefile;
      local_f0._0_8_ = (pointer)0x6;
      local_f0._8_8_ = "CMAKE_";
      local_f0._16_8_ = local_118._8_8_;
      pcStack_d8 = (char *)local_118._0_8_;
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_f0;
      cmCatViews_abi_cxx11_(&local_50,views_01);
      psVar7 = cmMakefile::GetSafeDefinition(local_70,&local_50);
    }
    local_f0._16_8_ = 1;
    pcStack_d8 = (char *)((long)"^date: +([^;]+); +author: +([^;]+);" + 0x22);
    local_c8 = (psVar7->_M_dataplus)._M_p;
    local_d0 = (char *)psVar7->_M_string_length;
    views_02._M_len = 3;
    views_02._M_array = (iterator)local_f0;
    local_f0._0_8_ = p_Var3;
    local_f0._8_8_ = pcVar2;
    cmCatViews_abi_cxx11_(&local_c0,views_02);
    std::__cxx11::string::operator=((string *)local_f8,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    config_00 = local_60;
    psVar7 = local_68;
    this_01 = local_78;
    if ((sVar4 == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2)) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    GetPchHeader((string *)local_f0,this_01,config_00,language,psVar7);
    GetPchFile(&local_c0,this_01,config_00,language,psVar7);
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"<PCH_HEADER>","");
    cmsys::SystemTools::ReplaceString((string *)local_f8,&local_98,(string *)local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"<PCH_FILE>","");
    cmsys::SystemTools::ReplaceString((string *)local_f8,&local_98,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((_Base_ptr)local_f0._0_8_ != (_Base_ptr)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if ((_Base_ptr)local_118._0_8_ != (_Base_ptr)(local_118 + 0x10)) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
  }
  psVar7 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,*(long *)(local_a0 + 2),
             (long)&(local_a0[2]._M_parent)->_M_color + *(long *)(local_a0 + 2));
  return psVar7;
}

Assistant:

std::string cmGeneratorTarget::GetPchUseCompileOptions(
  const std::string& config, const std::string& language,
  const std::string& arch)
{
  const auto inserted = this->PchUseCompileOptions.insert(
    std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    std::string& useOptionList = inserted.first->second;

    if (this->GetPropertyAsBool("PCH_WARN_INVALID")) {
      useOptionList = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_COMPILE_OPTIONS_INVALID_PCH"));
    }

    const std::string useOptVar =
      cmStrCat(language, "_COMPILE_OPTIONS_USE_PCH");

    std::string const& useOptionListProperty =
      this->GetSafeProperty(useOptVar);

    useOptionList = cmStrCat(
      useOptionList, ";",
      useOptionListProperty.empty()
        ? this->Makefile->GetSafeDefinition(cmStrCat("CMAKE_", useOptVar))
        : useOptionListProperty);

    const std::string pchHeader = this->GetPchHeader(config, language, arch);
    const std::string pchFile = this->GetPchFile(config, language, arch);

    cmSystemTools::ReplaceString(useOptionList, "<PCH_HEADER>", pchHeader);
    cmSystemTools::ReplaceString(useOptionList, "<PCH_FILE>", pchFile);
  }
  return inserted.first->second;
}